

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall
ON_PolyEdgeSegment::Create(ON_PolyEdgeSegment *this,ON_BrepTrim *trim,ON_UUID *object_id)

{
  double t0;
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  ON_Brep *pOVar5;
  ON_BrepEdge *this_00;
  ON_Curve *real_curve;
  ON_BrepFace *this_01;
  ON_Surface *pOVar6;
  double *pdVar7;
  ON_COMPONENT_INDEX OVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  ON_Interval real_curve_subdomain;
  int extraout_var;
  
  Init(this);
  if ((((trim != (ON_BrepTrim *)0x0) && (trim->m_ei < 0)) &&
      (pOVar5 = ON_BrepTrim::Brep(trim), pOVar5 != (ON_Brep *)0x0)) &&
     (this_00 = ON_BrepTrim::Edge(trim), this_00 != (ON_BrepEdge *)0x0)) {
    real_curve = ON_BrepEdge::EdgeCurveOf(this_00);
    if (real_curve == (ON_Curve *)0x0) {
      return real_curve != (ON_Curve *)0x0;
    }
    this->m_brep = pOVar5;
    this->m_trim = trim;
    this->m_edge = this_00;
    this_01 = ON_BrepTrim::Face(trim);
    this->m_face = this_01;
    if (this_01 != (ON_BrepFace *)0x0) {
      pOVar6 = ON_BrepFace::SurfaceOf(this_01);
      this->m_surface = pOVar6;
    }
    (*(this->m_edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_edge_domain).m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (this->m_edge_domain).m_t[1] = in_XMM1_Qa;
    (*(this->m_trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
      _vptr_ON_Object[0x25])();
    (this->m_trim_domain).m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    (this->m_trim_domain).m_t[1] = in_XMM1_Qa;
    real_curve_subdomain = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
    ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,real_curve,real_curve_subdomain);
    bVar4 = ON_CurveProxy::ProxyCurveIsReversed(&this->m_edge->super_ON_CurveProxy);
    if (bVar4) {
      ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
    }
    pdVar7 = ON_Interval::operator[](&this->m_edge_domain,0);
    t0 = *pdVar7;
    pdVar7 = ON_Interval::operator[](&this->m_edge_domain,1);
    ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,t0,*pdVar7);
    OVar8.m_type = (*(trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                     _vptr_ON_Object[0x22])(trim);
    OVar8.m_index = extraout_var;
    this->m_component_index = OVar8;
    uVar2 = object_id->Data2;
    uVar3 = object_id->Data3;
    uVar1 = *(undefined8 *)object_id->Data4;
    (this->m_object_id).Data1 = object_id->Data1;
    (this->m_object_id).Data2 = uVar2;
    (this->m_object_id).Data3 = uVar3;
    *(undefined8 *)(this->m_object_id).Data4 = uVar1;
    return true;
  }
  return false;
}

Assistant:

bool ON_PolyEdgeSegment::Create( 
                const ON_BrepTrim* trim,
                const ON_UUID& object_id
                )
{
  Init();
  if ( !trim )
    return false;
  if ( trim->m_ei >= 0 )
    return false;
  const ON_Brep* brep = trim->Brep();
  if ( !brep )
    return false;
  const ON_BrepEdge* edge = trim->Edge();
  if ( !edge )
    return false;
  const ON_Curve* c3 = edge->EdgeCurveOf();
  if ( !c3 )
    return false;
  m_brep = brep;
  m_trim = trim;
  m_edge = edge;
  m_face = trim->Face();
  if ( m_face )
    m_surface = m_face->SurfaceOf();
  m_edge_domain = m_edge->Domain();
  m_trim_domain = m_trim->Domain();
  ON_CurveProxy::SetProxyCurve( 
                    c3,
                    edge->ProxyCurveDomain()
                    );    
  if ( m_edge->ProxyCurveIsReversed() )
    ON_CurveProxy::Reverse();
  ON_CurveProxy::SetDomain( m_edge_domain[0], m_edge_domain[1] );
  m_component_index = trim->ComponentIndex();
  m_object_id = object_id;
  return true;
}